

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

void Js::JavascriptObject::CopyDataPropertiesForProxyObjects<true>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  BVIndex i;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  int iVar4;
  BOOL BVar5;
  JavascriptArray *pJVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  uint uVar8;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  Var local_60;
  Var propValue;
  RecyclableObject *local_50;
  ScriptContext *local_48;
  Type local_3c;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  Var aValue;
  
  propertyDescriptor._40_8_ = to;
  propValue = excluded;
  local_50 = from;
  pJVar6 = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from,scriptContext);
  local_3c = (pJVar6->super_ArrayObject).length;
  local_38 = (PropertyRecord *)0x0;
  local_60 = (Var)0x0;
  uVar8 = 0;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_48 = scriptContext;
  do {
    if (local_3c == uVar8) {
      return;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
    iVar4 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJVar6,(ulong)uVar8);
    aValue = (Var)CONCAT44(extraout_var,iVar4);
    bVar2 = VarIs<Js::JavascriptSymbol>(aValue);
    if (!bVar2) {
      bVar2 = VarIs<Js::JavascriptString>(aValue);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x6ed,
                                    "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                    ,
                                    "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                   );
        if (!bVar2) goto LAB_00b99864;
        *puVar7 = 0;
        scriptContext = local_48;
      }
    }
    JavascriptConversion::ToPropertyKey(aValue,scriptContext,&local_38,(PropertyString **)0x0);
    i = local_38->pid;
    if (i == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x6f1,"(propertyId != Constants::NoProperty)",
                                  "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty."
                                 );
      if (!bVar2) {
LAB_00b99864:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      scriptContext = local_48;
    }
    if (propValue == (Var)0x0) {
LAB_00b997e8:
      BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                        (local_50,local_38->pid,scriptContext,(PropertyDescriptor *)local_98);
      if (BVar5 != 0) {
        bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98);
        if (bVar2) {
          BVar5 = JavascriptOperators::GetOwnProperty
                            (local_50,i,&local_60,scriptContext,(PropertyValueInfo *)0x0);
          if (BVar5 == 0) {
LAB_00b99866:
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,L"Object.assign");
          }
          BVar5 = JavascriptOperators::SetProperty
                            ((Var)propertyDescriptor._40_8_,
                             (RecyclableObject *)propertyDescriptor._40_8_,i,local_60,scriptContext,
                             PropertyOperation_None);
          if (BVar5 == 0) goto LAB_00b99866;
        }
      }
    }
    else {
      BVar3 = BVSparse<Memory::Recycler>::Test((BVSparse<Memory::Recycler> *)propValue,i);
      if (BVar3 == '\0') goto LAB_00b997e8;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void JavascriptObject::CopyDataPropertiesForProxyObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper
    JavascriptArray *keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from, scriptContext);
    uint32 length = keys->GetLength();
    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var propValue = nullptr;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        // Spec doesn't strictly call for us to use ToPropertyKey but since we know nextKey is already a symbol or string primitive, ToPropertyKey will be a nop and return us the propertyRecord
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty.");

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(propertyId);
        }
        if (!found)
        {
            if (JavascriptOperators::GetOwnPropertyDescriptor(from, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    if (!JavascriptOperators::GetOwnProperty(from, propertyId, &propValue, scriptContext, nullptr))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                    if (assign)
                    {
                        if (!JavascriptOperators::SetProperty(to, to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                    else
                    {
                        if (!CreateDataProperty(to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                }
            }
        }
    }
}